

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

void ma_fader_set_fade_ex
               (ma_fader *pFader,float volumeBeg,float volumeEnd,ma_uint64 lengthInFrames,
               ma_int64 startOffsetInFrames)

{
  ma_uint64 mVar1;
  long lVar2;
  
  if (pFader != (ma_fader *)0x0) {
    if (volumeBeg < 0.0) {
      volumeBeg = ma_fader_get_current_volume(pFader);
    }
    mVar1 = 0xffffffff;
    if (lengthInFrames < 0xffffffff) {
      mVar1 = lengthInFrames;
    }
    lVar2 = 0x7fffffff;
    if (startOffsetInFrames < 0x7fffffff) {
      lVar2 = startOffsetInFrames;
    }
    pFader->volumeBeg = volumeBeg;
    pFader->volumeEnd = volumeEnd;
    pFader->lengthInFrames = mVar1;
    pFader->cursorInFrames = -lVar2;
  }
  return;
}

Assistant:

MA_API void ma_fader_set_fade_ex(ma_fader* pFader, float volumeBeg, float volumeEnd, ma_uint64 lengthInFrames, ma_int64 startOffsetInFrames)
{
    if (pFader == NULL) {
        return;
    }

    /* If the volume is negative, use current volume. */
    if (volumeBeg < 0) {
        volumeBeg = ma_fader_get_current_volume(pFader);
    }

    /*
    The length needs to be clamped to 32-bits due to how we convert it to a float for linear
    interpolation reasons. I might change this requirement later, but for now it's not important.
    */
    if (lengthInFrames > UINT_MAX) {
        lengthInFrames = UINT_MAX;
    }

    /* The start offset needs to be clamped to ensure it doesn't overflow a signed number. */
    if (startOffsetInFrames > INT_MAX) {
        startOffsetInFrames = INT_MAX;
    }

    pFader->volumeBeg      = volumeBeg;
    pFader->volumeEnd      = volumeEnd;
    pFader->lengthInFrames = lengthInFrames;
    pFader->cursorInFrames = -startOffsetInFrames;
}